

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH41
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  size_t *psVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  void *pvVar17;
  byte bVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  ushort uVar25;
  short sVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  size_t *psVar34;
  long lVar35;
  ulong uVar36;
  uint uVar37;
  uint uVar38;
  size_t sVar39;
  int iVar40;
  ulong uVar41;
  char cVar42;
  size_t key_1;
  long lVar43;
  ulong uVar44;
  uint uVar45;
  int *piVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  ushort uVar50;
  ulong uVar51;
  ulong uVar52;
  bool bVar53;
  undefined1 auVar54 [16];
  ulong local_150;
  int *local_148;
  int *local_140;
  ulong local_130;
  ulong local_118;
  ulong local_110;
  ulong local_e0;
  ulong local_c8;
  size_t *local_b8;
  ulong local_b0;
  ulong local_a0;
  
  bVar18 = literal_context_lut[8];
  lVar7 = *(long *)(literal_context_lut + 0x10);
  uVar4 = (position - 3) + num_bytes;
  sVar39 = position;
  if (3 < num_bytes) {
    sVar39 = uVar4;
  }
  lVar43 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar43 = 0x40;
  }
  local_118 = *(ulong *)dist_cache;
  iVar11 = *(int *)&(hasher->common).extra;
  *(int *)&(hasher->common).dict_num_matches = iVar11 + -1;
  *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar11 + 1;
  (hasher->common).params.type = iVar11 + -2;
  (hasher->common).params.bucket_bits = iVar11 + 2;
  (hasher->common).params.block_bits = iVar11 + -3;
  (hasher->common).params.hash_len = iVar11 + 3;
  uVar1 = position + num_bytes;
  if (uVar1 <= position + 4) {
    local_b8 = last_insert_len;
LAB_0010b57a:
    *(ulong *)dist_cache = (local_118 + uVar1) - position;
    *(long *)commands = *(long *)commands + ((long)local_b8 - (long)last_insert_len >> 4);
    return;
  }
  uVar31 = (1L << (bVar18 & 0x3f)) - 0x10;
  local_150 = lVar43 + position;
  lVar3 = position - 1;
  local_b8 = last_insert_len;
  uVar32 = position;
  auVar54 = _DAT_0013b100;
LAB_00109a9e:
  uVar19 = uVar1 - uVar32;
  uVar21 = uVar31;
  if (uVar32 < uVar31) {
    uVar21 = uVar32;
  }
  local_a0 = lVar7 + uVar32;
  if (uVar31 <= lVar7 + uVar32) {
    local_a0 = uVar31;
  }
  uVar14 = *(ulong *)(literal_context_lut + 0x50);
  lVar27 = *(long *)&params->dist;
  uVar41 = uVar32 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar41);
  iVar11 = *(int *)(ringbuffer + uVar41);
  psVar34 = *(size_t **)backward_references;
  if (back_refs_position <= psVar34) {
    bVar53 = false;
    bVar9 = back_refs_position == (size_t *)0x0;
LAB_00109c3a:
    uVar37 = (uint)(iVar11 * 0x1e35a7bd) >> 0x11;
    uVar51 = (ulong)uVar37;
    uVar33 = (ulong)((uint)uVar19 & 7);
    uVar36 = uVar19 & 0xfffffffffffffff8;
    local_110 = 0x7e4;
    uVar20 = 0;
    lVar30 = 0;
    local_e0 = 0;
    local_c8 = 0;
    do {
      uVar15 = (ulong)*(int *)((long)&(hasher->common).extra + lVar30 * 4);
      uVar22 = uVar32 - uVar15;
      cVar42 = (char)uVar37;
      if ((((lVar30 == 0) || (*(char *)(lVar27 + 0x30000 + (uVar22 & 0xffff)) == cVar42)) &&
          (uVar15 <= uVar21)) && (uVar22 < uVar32)) {
        if (7 < uVar19) {
          lVar48 = 0;
          uVar44 = 0;
LAB_00109cff:
          if (*(ulong *)(piVar2 + uVar44 * 2) ==
              *(ulong *)(ringbuffer + uVar44 * 8 + (uVar22 & ringbuffer_mask)))
          goto code_r0x00109d11;
          uVar44 = *(ulong *)(ringbuffer + uVar44 * 8 + (uVar22 & ringbuffer_mask)) ^
                   *(ulong *)(piVar2 + uVar44 * 2);
          uVar22 = 0;
          if (uVar44 != 0) {
            for (; (uVar44 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
          uVar44 = (uVar22 >> 3 & 0x1fffffff) - lVar48;
          goto LAB_00109d59;
        }
        piVar46 = piVar2;
        uVar49 = 0;
LAB_00109dec:
        uVar44 = uVar49;
        if (uVar33 != 0) {
          uVar52 = uVar33 | uVar49;
          uVar23 = uVar33;
          do {
            uVar44 = uVar49;
            if (ringbuffer[uVar49 + (uVar22 & ringbuffer_mask)] != (uint8_t)*piVar46) break;
            piVar46 = (int *)((long)piVar46 + 1);
            uVar49 = uVar49 + 1;
            uVar23 = uVar23 - 1;
            uVar44 = uVar52;
          } while (uVar23 != 0);
        }
LAB_00109d59:
        if ((bVar53) &&
           (uVar22 = (ulong)(int)num_literals[(long)psVar34 * 2], uVar22 < uVar44 + uVar32)) {
          uVar44 = uVar22 - uVar32;
        }
        if ((1 < uVar44) && (uVar22 = uVar44 * 0x87 + 0x78f, local_110 < uVar22)) {
          if (lVar30 != 0) {
            uVar22 = uVar22 - ((0x1ca10U >> ((byte)lVar30 & 0xe) & 0xe) + 0x27);
          }
          if (local_110 < uVar22) {
            uVar20 = uVar44;
            local_110 = uVar22;
            local_e0 = uVar44;
            local_c8 = uVar15;
          }
        }
      }
      lVar30 = lVar30 + 1;
    } while (lVar30 != 10);
    lVar30 = *(long *)&(params->hasher).num_last_distances_to_check;
    uVar22 = uVar32 - *(uint *)(lVar27 + uVar51 * 4);
    uVar25 = *(ushort *)(lVar27 + 0x20000 + uVar51 * 2);
    if (lVar30 != 0) {
      uVar44 = 0;
      uVar15 = uVar22;
      uVar50 = uVar25;
      do {
        uVar44 = uVar15 + uVar44;
        if (uVar21 < uVar44) break;
        if (uVar41 + uVar20 <= ringbuffer_mask) {
          uVar15 = uVar32 - uVar44 & ringbuffer_mask;
          if ((uVar15 + uVar20 <= ringbuffer_mask) &&
             (ringbuffer[uVar41 + uVar20] == ringbuffer[uVar15 + uVar20])) {
            if (7 < uVar19) {
              lVar48 = 0;
              uVar49 = 0;
LAB_00109eae:
              if (*(ulong *)(piVar2 + uVar49 * 2) == *(ulong *)(ringbuffer + uVar49 * 8 + uVar15))
              goto code_r0x00109ec0;
              uVar49 = *(ulong *)(ringbuffer + uVar49 * 8 + uVar15) ^
                       *(ulong *)(piVar2 + uVar49 * 2);
              uVar15 = 0;
              if (uVar49 != 0) {
                for (; (uVar49 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                }
              }
              uVar49 = (uVar15 >> 3 & 0x1fffffff) - lVar48;
              goto LAB_00109f1d;
            }
            piVar46 = piVar2;
            uVar23 = 0;
LAB_00109f87:
            uVar49 = uVar23;
            if (uVar33 != 0) {
              uVar47 = uVar33 | uVar23;
              uVar52 = uVar33;
              do {
                uVar49 = uVar23;
                if (ringbuffer[uVar23 + uVar15] != (uint8_t)*piVar46) break;
                piVar46 = (int *)((long)piVar46 + 1);
                uVar23 = uVar23 + 1;
                uVar52 = uVar52 - 1;
                uVar49 = uVar47;
              } while (uVar52 != 0);
            }
LAB_00109f1d:
            if ((bVar53) &&
               (uVar15 = (ulong)(int)num_literals[(long)psVar34 * 2], uVar15 < uVar49 + uVar32)) {
              uVar49 = uVar15 - uVar32;
            }
            if (3 < uVar49) {
              iVar11 = 0x1f;
              if ((uint)uVar44 != 0) {
                for (; (uint)uVar44 >> iVar11 == 0; iVar11 = iVar11 + -1) {
                }
              }
              uVar15 = (ulong)(iVar11 * -0x1e + 0x780) + uVar49 * 0x87;
              if (local_110 < uVar15) {
                uVar20 = uVar49;
                local_110 = uVar15;
                local_e0 = uVar49;
                local_c8 = uVar44;
              }
            }
          }
        }
        uVar15 = (ulong)uVar50;
        uVar50 = *(ushort *)(lVar27 + 0x40002 + uVar15 * 4);
        uVar15 = (ulong)*(ushort *)(lVar27 + 0x40000 + uVar15 * 4);
        lVar30 = lVar30 + -1;
      } while (lVar30 != 0);
    }
    uVar50 = (ushort)(params->hasher).block_bits;
    *(ushort *)&(params->hasher).block_bits = uVar50 + 1;
    *(char *)(lVar27 + 0x30000 + (uVar32 & 0xffff)) = cVar42;
    if (0xfffe < uVar22) {
      uVar22 = 0xffff;
    }
    *(short *)(lVar27 + 0x40000 + (ulong)uVar50 * 4) = (short)uVar22;
    *(ushort *)(lVar27 + 0x40002 + (ulong)uVar50 * 4) = uVar25;
    *(int *)(lVar27 + uVar51 * 4) = (int)uVar32;
    *(ushort *)(lVar27 + 0x20000 + uVar51 * 2) = uVar50;
    if (local_110 != 0x7e4) {
      iVar11 = 0;
      bVar53 = true;
      goto LAB_0010a27b;
    }
    if (!bVar9) {
      psVar34 = *(size_t **)backward_references;
      goto LAB_0010ac56;
    }
    lVar27 = *(long *)&(params->dist).alphabet_size_max;
    uVar21 = *(ulong *)(lVar27 + 8);
    local_130 = *(ulong *)(lVar27 + 0x10);
    bVar9 = true;
    if (uVar21 >> 7 <= local_130) {
      uVar41 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      lVar30 = *(long *)(literal_context_lut + 0x78);
      iVar11 = 0;
      local_110 = 0x7e4;
      bVar53 = true;
LAB_0010a0aa:
      uVar21 = uVar21 + 1;
      *(ulong *)(lVar27 + 8) = uVar21;
      bVar18 = *(byte *)(lVar30 + uVar41);
      uVar20 = (ulong)bVar18;
      if ((uVar20 != 0) && (uVar20 <= uVar19)) {
        uVar33 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar41 * 2);
        lVar48 = *(long *)(literal_context_lut + 0x58);
        pcVar24 = (char *)(uVar33 * uVar20 + *(long *)(lVar48 + 0xa8) +
                          (ulong)*(uint *)(lVar48 + 0x20 + uVar20 * 4));
        if (7 < bVar18) {
          uVar51 = (ulong)(bVar18 & 0xfffffff8);
          lVar35 = 0;
          uVar36 = 0;
LAB_0010a107:
          if (*(ulong *)(pcVar24 + uVar36 * 8) == *(ulong *)(piVar2 + uVar36 * 2))
          goto code_r0x0010a119;
          uVar51 = *(ulong *)(piVar2 + uVar36 * 2) ^ *(ulong *)(pcVar24 + uVar36 * 8);
          uVar36 = 0;
          if (uVar51 != 0) {
            for (; (uVar51 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
            }
          }
          uVar36 = (uVar36 >> 3 & 0x1fffffff) - lVar35;
          goto LAB_0010a14f;
        }
        uVar51 = 0;
        goto LAB_0010a228;
      }
      goto LAB_0010a20d;
    }
    goto LAB_0010ab5c;
  }
  uVar20 = (ulong)(int)num_literals[(long)psVar34 * 2];
  if (uVar20 < uVar32) {
    psVar13 = num_literals + (long)psVar34 * 2;
    do {
      psVar34 = (size_t *)((long)psVar34 + 1);
      if (back_refs_position == psVar34) {
        *(size_t **)backward_references = psVar34;
        bVar53 = false;
        psVar34 = back_refs_position;
        goto LAB_00109c2e;
      }
      uVar20 = (ulong)(int)psVar13[2];
      psVar13 = psVar13 + 2;
    } while (uVar20 < uVar32);
    *(size_t **)backward_references = psVar34;
    bVar53 = psVar34 < back_refs_position;
  }
  else {
    psVar13 = num_literals + (long)psVar34 * 2;
    bVar53 = true;
  }
  if (uVar32 != uVar20) {
LAB_00109c2e:
    bVar9 = false;
    goto LAB_00109c3a;
  }
  uVar37 = (uint)psVar13[1];
  local_c8 = (ulong)(int)uVar37;
  if ((uVar32 - local_c8 < uVar32) && (uVar37 <= *(uint *)((long)psVar13 + 0xc))) {
    uVar21 = uVar32 - local_c8 & ringbuffer_mask;
    if (7 < uVar19) {
      uVar14 = uVar19 & 0xfffffffffffffff8;
      local_140 = (int *)(ringbuffer + uVar14 + uVar41);
      lVar27 = 0;
      uVar41 = 0;
LAB_00109be4:
      if (*(ulong *)(piVar2 + uVar41 * 2) == *(ulong *)(ringbuffer + uVar41 * 8 + uVar21))
      goto code_r0x00109bfa;
      uVar14 = *(ulong *)(ringbuffer + uVar41 * 8 + uVar21) ^ *(ulong *)(piVar2 + uVar41 * 2);
      uVar21 = 0;
      if (uVar14 != 0) {
        for (; (uVar14 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
        }
      }
      uVar41 = (uVar21 >> 3 & 0x1fffffff) - lVar27;
      goto LAB_0010ae6f;
    }
    uVar14 = 0;
    local_140 = piVar2;
LAB_0010b4fa:
    uVar20 = uVar19 & 7;
    uVar41 = uVar14;
    if (uVar20 != 0) {
      uVar33 = uVar14 | uVar20;
      do {
        uVar41 = uVar14;
        if (ringbuffer[uVar14 + uVar21] != (uint8_t)*local_140) break;
        local_140 = (int *)((long)local_140 + 1);
        uVar14 = uVar14 + 1;
        uVar20 = uVar20 - 1;
        uVar41 = uVar33;
      } while (uVar20 != 0);
    }
LAB_0010ae6f:
    local_e0 = (ulong)*(int *)((long)num_literals + (long)psVar34 * 0x10 + 4);
    if (uVar41 < local_e0) {
      local_e0 = uVar41;
    }
    iVar11 = 0x1f;
    if (uVar37 != 0) {
      for (; uVar37 >> iVar11 == 0; iVar11 = iVar11 + -1) {
      }
    }
    local_110 = (ulong)(iVar11 * -0x1e + 0x780) + local_e0 * 0x87;
    bVar9 = false;
    bVar53 = false;
    iVar11 = 0;
    goto LAB_0010a27b;
  }
LAB_0010ac56:
  if ((psVar34 < back_refs_position) && (uVar32 == (long)(int)num_literals[(long)psVar34 * 2])) {
    uVar37 = (uint)num_literals[(long)psVar34 * 2 + 1];
    local_c8 = (ulong)(int)uVar37;
    if (*(int *)((long)num_literals + (long)psVar34 * 0x10 + 0xc) < (int)uVar37) {
      uVar45 = *(uint *)((long)num_literals + (long)psVar34 * 0x10 + 4);
      uVar14 = (ulong)uVar45;
      if (uVar45 - 4 < 0x15 && (int)uVar37 < 0x7ffffffd) {
        uVar38 = ~(uint)uVar21 + uVar37;
        lVar27 = *(long *)(literal_context_lut + 0x58);
        if ((int)uVar38 >> (*(byte *)(lVar27 + uVar14) & 0x1f) <
            *(int *)(literal_context_lut + 0x60)) {
          uVar6 = *(uint *)(lVar27 + 0x20 + uVar14 * 4);
          uVar5 = kBitMask[*(byte *)(lVar27 + uVar14)];
          lVar27 = *(long *)(lVar27 + 0xa8);
          uVar16 = BrotliGetTransforms();
          pvVar17 = malloc(uVar14 * 10);
          iVar11 = BrotliTransformDictionaryWord
                             (pvVar17,(ulong)uVar6 + lVar27 + (long)(int)((uVar38 & uVar5) * uVar45)
                              ,uVar45,uVar16);
          local_e0 = (ulong)iVar11;
          iVar12 = bcmp(piVar2,pvVar17,local_e0);
          auVar54 = _DAT_0013b100;
          if (iVar12 == 0) {
            iVar12 = 0x1f;
            if (uVar37 != 0) {
              for (; uVar37 >> iVar12 == 0; iVar12 = iVar12 + -1) {
              }
            }
            local_110 = (ulong)(iVar12 * -0x1e + 0x780) + local_e0 * 0x87;
            iVar11 = uVar45 - iVar11;
            bVar9 = false;
            bVar53 = false;
            goto LAB_0010a27b;
          }
        }
      }
    }
  }
  local_118 = local_118 + 1;
  position = uVar32 + 1;
  goto LAB_0010b2c7;
code_r0x00109d11:
  uVar44 = uVar44 + 1;
  lVar48 = lVar48 + -8;
  piVar46 = (int *)(ringbuffer + uVar36 + uVar41);
  uVar49 = uVar36;
  if (uVar19 >> 3 == uVar44) goto LAB_00109dec;
  goto LAB_00109cff;
code_r0x00109ec0:
  uVar49 = uVar49 + 1;
  lVar48 = lVar48 + -8;
  piVar46 = (int *)(ringbuffer + uVar36 + uVar41);
  uVar23 = uVar36;
  if (uVar19 >> 3 == uVar49) goto LAB_00109f87;
  goto LAB_00109eae;
code_r0x0010a119:
  uVar36 = uVar36 + 1;
  lVar35 = lVar35 + -8;
  if (bVar18 >> 3 == uVar36) goto code_r0x0010a125;
  goto LAB_0010a107;
code_r0x0010a125:
  pcVar24 = pcVar24 + -lVar35;
LAB_0010a228:
  uVar22 = uVar20 & 7;
  uVar36 = uVar51;
  if ((bVar18 & 7) != 0) {
    uVar15 = uVar51 | uVar22;
    do {
      uVar36 = uVar51;
      if (*(char *)((long)piVar2 + uVar51) != *pcVar24) break;
      pcVar24 = pcVar24 + 1;
      uVar51 = uVar51 + 1;
      uVar22 = uVar22 - 1;
      uVar36 = uVar15;
    } while (uVar22 != 0);
  }
LAB_0010a14f:
  if (((uVar36 != 0) && (uVar20 < *(uint *)(literal_context_lut + 100) + uVar36)) &&
     (uVar20 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar20 - uVar36) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar20 - uVar36) * 4 << (*(byte *)(lVar48 + uVar20) & 0x3f)) +
               uVar33 + local_a0 + 1, uVar20 <= uVar14)) {
    iVar12 = 0x1f;
    if ((uint)uVar20 != 0) {
      for (; (uint)uVar20 >> iVar12 == 0; iVar12 = iVar12 + -1) {
      }
    }
    uVar33 = (uVar36 * 0x87 - (ulong)(uint)(iVar12 * 0x1e)) + 0x780;
    if (local_110 <= uVar33) {
      iVar11 = (uint)bVar18 - (int)uVar36;
      local_130 = local_130 + 1;
      *(ulong *)(lVar27 + 0x10) = local_130;
      local_110 = uVar33;
      local_e0 = uVar36;
      local_c8 = uVar20;
    }
  }
LAB_0010a20d:
  uVar41 = uVar41 + 1;
  bVar9 = !bVar53;
  bVar53 = false;
  if (bVar9) goto LAB_0010ad88;
  goto LAB_0010a0aa;
LAB_0010ad88:
  bVar9 = true;
  bVar53 = true;
LAB_0010a27b:
  if (local_110 < 0x7e5) {
LAB_0010ab5c:
    local_118 = local_118 + 1;
    position = uVar32 + 1;
    if (bVar9 && local_150 < position) {
      if ((uint)((int)lVar43 * 4) + local_150 < position) {
        uVar19 = uVar32 + 0x11;
        if (uVar1 - 4 <= uVar32 + 0x11) {
          uVar19 = uVar1 - 4;
        }
        if (uVar19 <= position) goto LAB_0010b2c7;
        lVar27 = *(long *)&params->dist;
        uVar25 = (ushort)(params->hasher).block_bits;
        do {
          uVar37 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar32 = (ulong)uVar37;
          uVar21 = position - *(uint *)(lVar27 + uVar32 * 4);
          *(char *)(lVar27 + 0x30000 + (position & 0xffff)) = (char)uVar37;
          if (0xfffe < uVar21) {
            uVar21 = 0xffff;
          }
          uVar50 = uVar25 + 1;
          *(short *)(lVar27 + 0x40000 + (ulong)uVar25 * 4) = (short)uVar21;
          *(undefined2 *)(lVar27 + 0x40002 + (ulong)uVar25 * 4) =
               *(undefined2 *)(lVar27 + 0x20000 + uVar32 * 2);
          *(int *)(lVar27 + uVar32 * 4) = (int)position;
          *(ushort *)(lVar27 + 0x20000 + uVar32 * 2) = uVar25;
          local_118 = local_118 + 4;
          position = position + 4;
          uVar25 = uVar50;
        } while (position < uVar19);
      }
      else {
        uVar19 = uVar32 + 9;
        if (uVar4 <= uVar32 + 9) {
          uVar19 = uVar4;
        }
        if (uVar19 <= position) goto LAB_0010b2c7;
        lVar27 = *(long *)&params->dist;
        uVar25 = (ushort)(params->hasher).block_bits;
        do {
          uVar37 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar32 = (ulong)uVar37;
          uVar21 = position - *(uint *)(lVar27 + uVar32 * 4);
          *(char *)(lVar27 + 0x30000 + (position & 0xffff)) = (char)uVar37;
          if (0xfffe < uVar21) {
            uVar21 = 0xffff;
          }
          uVar50 = uVar25 + 1;
          *(short *)(lVar27 + 0x40000 + (ulong)uVar25 * 4) = (short)uVar21;
          *(undefined2 *)(lVar27 + 0x40002 + (ulong)uVar25 * 4) =
               *(undefined2 *)(lVar27 + 0x20000 + uVar32 * 2);
          *(int *)(lVar27 + uVar32 * 4) = (int)position;
          *(ushort *)(lVar27 + 0x20000 + uVar32 * 2) = uVar25;
          local_118 = local_118 + 2;
          position = position + 2;
          uVar25 = uVar50;
        } while (position < uVar19);
      }
      *(ushort *)&(params->hasher).block_bits = uVar50;
    }
    goto LAB_0010b2c7;
  }
  local_130 = local_e0;
  uVar21 = local_118;
  if (bVar53) {
    uVar41 = local_118 + 4;
    uVar20 = (lVar3 + num_bytes) - uVar32;
    iVar40 = 0;
    uVar14 = uVar32;
    iVar12 = iVar11;
LAB_0010a2b9:
    uVar33 = uVar20 >> 3;
    uVar19 = uVar19 - 1;
    uVar21 = local_e0 - 1;
    if (uVar19 <= local_e0 - 1) {
      uVar21 = uVar19;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar21 = 0;
    }
    uVar32 = uVar14 + 1;
    uVar36 = uVar31;
    if (uVar32 < uVar31) {
      uVar36 = uVar32;
    }
    local_a0 = lVar7 + uVar14 + 1;
    if (uVar31 <= local_a0) {
      local_a0 = uVar31;
    }
    uVar51 = *(ulong *)(literal_context_lut + 0x50);
    lVar27 = *(long *)&params->dist;
    uVar22 = uVar32 & ringbuffer_mask;
    iVar11 = *(int *)(ringbuffer + uVar22);
    local_148 = (int *)(ringbuffer + uVar22);
    psVar34 = *(size_t **)backward_references;
    bVar53 = true;
    if (back_refs_position <= psVar34) {
LAB_0010a3fd:
      uVar37 = (uint)(iVar11 * 0x1e35a7bd) >> 0x11;
      uVar49 = (ulong)uVar37;
      uVar44 = (ulong)((uint)uVar19 & 7);
      uVar15 = 0x7e4;
      lVar30 = 0;
      local_130 = 0;
      local_150 = 0;
LAB_0010a43c:
      uVar52 = (ulong)*(int *)((long)&(hasher->common).extra + lVar30 * 4);
      uVar23 = uVar32 - uVar52;
      cVar42 = (char)uVar37;
      if ((((lVar30 == 0) || (*(char *)(lVar27 + 0x30000 + (uVar23 & 0xffff)) == cVar42)) &&
          (uVar52 <= uVar36)) && (uVar23 < uVar32)) {
        uVar47 = uVar44;
        if (7 < uVar19) {
          lVar48 = 0;
          uVar28 = 0;
LAB_0010a488:
          if (*(ulong *)(local_148 + uVar28 * 2) ==
              *(ulong *)(ringbuffer + uVar28 * 8 + (uVar23 & ringbuffer_mask)))
          goto code_r0x0010a49a;
          uVar47 = *(ulong *)(ringbuffer + uVar28 * 8 + (uVar23 & ringbuffer_mask)) ^
                   *(ulong *)(local_148 + uVar28 * 2);
          uVar23 = 0;
          if (uVar47 != 0) {
            for (; (uVar47 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
            }
          }
          uVar28 = (uVar23 >> 3 & 0x1fffffff) - lVar48;
          goto LAB_0010a4cc;
        }
        uVar28 = 0;
        piVar2 = local_148;
        goto joined_r0x0010a559;
      }
      goto LAB_0010a537;
    }
    uVar15 = (ulong)(int)num_literals[(long)psVar34 * 2];
    if (uVar15 < uVar32) {
      psVar13 = num_literals + (long)psVar34 * 2;
      do {
        psVar34 = (size_t *)((long)psVar34 + 1);
        if (back_refs_position == psVar34) {
          *(size_t **)backward_references = psVar34;
          psVar34 = back_refs_position;
          goto LAB_0010a3fd;
        }
        uVar15 = (ulong)(int)psVar13[2];
        psVar13 = psVar13 + 2;
      } while (uVar15 < uVar32);
      *(size_t **)backward_references = psVar34;
      bVar53 = back_refs_position <= psVar34;
    }
    else {
      psVar13 = num_literals + (long)psVar34 * 2;
      bVar53 = false;
    }
    if (uVar32 != uVar15 || bVar9) goto LAB_0010a3fd;
    uVar21 = (ulong)(int)(uint)psVar13[1];
    if ((uVar32 <= uVar32 - uVar21) || (*(uint *)((long)psVar13 + 0xc) < (uint)psVar13[1])) {
      local_150 = 0;
      local_130 = 0;
      goto LAB_0010aa70;
    }
    uVar14 = uVar32 - uVar21 & ringbuffer_mask;
    if (uVar19 < 8) {
      uVar41 = 0;
      goto LAB_0010b543;
    }
    lVar27 = 0;
    uVar41 = 0;
    goto LAB_0010b44b;
  }
LAB_0010af1a:
  local_118 = uVar21;
  if (local_a0 < local_c8) {
LAB_0010af24:
    uVar21 = local_c8 + 0xf;
LAB_0010af28:
    if ((local_c8 <= local_a0) && (uVar21 != 0)) {
      *(int *)((long)&(hasher->common).dict_num_lookups + 4) =
           (int)(hasher->common).dict_num_lookups;
      *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
      iVar12 = (int)local_c8;
      *(int *)&(hasher->common).extra = iVar12;
      *(int *)&(hasher->common).dict_num_matches = iVar12 + auVar54._0_4_;
      *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar12 + auVar54._4_4_;
      (hasher->common).params.type = iVar12 + auVar54._8_4_;
      (hasher->common).params.bucket_bits = iVar12 + auVar54._12_4_;
      (hasher->common).params.block_bits = iVar12 + -3;
      (hasher->common).params.hash_len = iVar12 + 3;
    }
  }
  else {
    uVar19 = (ulong)*(int *)&(hasher->common).extra;
    if (local_c8 != uVar19) {
      uVar14 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
      uVar21 = 1;
      if (local_c8 != uVar14) {
        uVar19 = (local_c8 + 3) - uVar19;
        if (uVar19 < 7) {
          bVar18 = (byte)((int)uVar19 << 2);
          uVar37 = 0x9750468;
        }
        else {
          uVar14 = (local_c8 + 3) - uVar14;
          if (6 < uVar14) {
            uVar21 = 2;
            if ((local_c8 != (long)(int)(hasher->common).dict_num_lookups) &&
               (uVar21 = 3, local_c8 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)
               )) goto LAB_0010af24;
            goto LAB_0010af28;
          }
          bVar18 = (byte)((int)uVar14 << 2);
          uVar37 = 0xfdb1ace;
        }
        uVar21 = (ulong)(uVar37 >> (bVar18 & 0x1f) & 0xf);
      }
      goto LAB_0010af28;
    }
    uVar21 = 0;
  }
  *(int *)local_b8 = (int)local_118;
  *(uint *)((long)local_b8 + 4) = iVar11 << 0x19 | (uint)local_130;
  uVar19 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  iVar12 = 0;
  if (uVar19 <= uVar21) {
    bVar18 = (byte)*(uint *)(literal_context_lut + 0x40);
    uVar14 = ((4L << (bVar18 & 0x3f)) + (uVar21 - *(uint *)(literal_context_lut + 0x44))) - 0x10;
    uVar37 = 0x1f;
    uVar45 = (uint)uVar14;
    if (uVar45 != 0) {
      for (; uVar45 >> uVar37 == 0; uVar37 = uVar37 - 1) {
      }
    }
    uVar37 = (uVar37 ^ 0xffffffe0) + 0x1f;
    uVar41 = (ulong)((uVar14 >> ((ulong)uVar37 & 0x3f) & 1) != 0);
    lVar27 = (ulong)uVar37 - (ulong)*(uint *)(literal_context_lut + 0x40);
    uVar21 = (~(-1 << (bVar18 & 0x1f)) & uVar45) + uVar19 +
             (uVar41 + lVar27 * 2 + 0xfffe << (bVar18 & 0x3f)) | lVar27 * 0x400;
    iVar12 = (int)(uVar14 - (uVar41 + 2 << ((byte)uVar37 & 0x3f)) >> (bVar18 & 0x3f));
  }
  *(short *)((long)local_b8 + 0xe) = (short)uVar21;
  *(int *)(local_b8 + 1) = iVar12;
  uVar19 = local_118;
  if (5 < local_118) {
    if (local_118 < 0x82) {
      uVar37 = 0x1f;
      uVar45 = (uint)(local_118 - 2);
      if (uVar45 != 0) {
        for (; uVar45 >> uVar37 == 0; uVar37 = uVar37 - 1) {
        }
      }
      uVar19 = (ulong)((int)(local_118 - 2 >> ((char)(uVar37 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar37 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (local_118 < 0x842) {
      uVar45 = (int)local_118 - 0x42;
      uVar37 = 0x1f;
      if (uVar45 != 0) {
        for (; uVar45 >> uVar37 == 0; uVar37 = uVar37 - 1) {
        }
      }
      uVar19 = (ulong)((uVar37 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar19 = 0x15;
      if (0x1841 < local_118) {
        uVar19 = (ulong)(ushort)(0x17 - (local_118 < 0x5842));
      }
    }
  }
  uVar37 = iVar11 + (uint)local_130;
  if (uVar37 < 10) {
    uVar45 = uVar37 - 2;
  }
  else if (uVar37 < 0x86) {
    uVar37 = uVar37 - 6;
    uVar45 = 0x1f;
    if (uVar37 != 0) {
      for (; uVar37 >> uVar45 == 0; uVar45 = uVar45 - 1) {
      }
    }
    uVar45 = (uVar37 >> ((char)(uVar45 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar45 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar45 = 0x17;
    if (uVar37 < 0x846) {
      uVar45 = 0x1f;
      if (uVar37 - 0x46 != 0) {
        for (; uVar37 - 0x46 >> uVar45 == 0; uVar45 = uVar45 - 1) {
        }
      }
      uVar45 = (uVar45 ^ 0xffe0) + 0x2c;
    }
  }
  uVar25 = (ushort)uVar45;
  sVar26 = (uVar25 & 7) + ((ushort)uVar19 & 7) * 8;
  if ((((uVar21 & 0x3ff) == 0) && ((ushort)uVar19 < 8)) && (uVar25 < 0x10)) {
    if (7 < uVar25) {
      sVar26 = sVar26 + 0x40;
    }
  }
  else {
    iVar11 = (int)((uVar19 & 0xffff) >> 3) * 3 + ((uVar45 & 0xffff) >> 3);
    sVar26 = sVar26 + ((ushort)(0x520d40 >> ((char)iVar11 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar11 * 0x40 + 0x40;
  }
  *(short *)((long)local_b8 + 0xc) = sVar26;
  *num_commands = *num_commands + local_118;
  position = uVar32 + local_130;
  uVar19 = sVar39;
  if (position < sVar39) {
    uVar19 = position;
  }
  uVar21 = uVar32 + 2;
  if (local_c8 < local_130 >> 2) {
    uVar14 = position + local_c8 * -4;
    if (uVar14 < uVar21) {
      uVar14 = uVar21;
    }
    uVar21 = uVar14;
    if (uVar19 < uVar14) {
      uVar21 = uVar19;
    }
  }
  local_150 = lVar43 + local_130 * 2 + uVar32;
  local_b8 = local_b8 + 2;
  if (uVar21 < uVar19) {
    lVar27 = *(long *)&params->dist;
    uVar25 = (ushort)(params->hasher).block_bits;
    do {
      uVar37 = (uint)(*(int *)(ringbuffer + (uVar21 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar32 = (ulong)uVar37;
      uVar14 = uVar21 - *(uint *)(lVar27 + uVar32 * 4);
      *(char *)(lVar27 + 0x30000 + (uVar21 & 0xffff)) = (char)uVar37;
      if (0xfffe < uVar14) {
        uVar14 = 0xffff;
      }
      uVar50 = uVar25 + 1;
      *(short *)(lVar27 + 0x40000 + (ulong)uVar25 * 4) = (short)uVar14;
      *(undefined2 *)(lVar27 + 0x40002 + (ulong)uVar25 * 4) =
           *(undefined2 *)(lVar27 + 0x20000 + uVar32 * 2);
      *(int *)(lVar27 + uVar32 * 4) = (int)uVar21;
      *(ushort *)(lVar27 + 0x20000 + uVar32 * 2) = uVar25;
      uVar21 = uVar21 + 1;
      uVar25 = uVar50;
    } while (uVar19 != uVar21);
    *(ushort *)&(params->hasher).block_bits = uVar50;
    local_118 = 0;
  }
  else {
    local_118 = 0;
  }
LAB_0010b2c7:
  uVar32 = position;
  if (uVar1 <= position + 4) goto LAB_0010b57a;
  goto LAB_00109a9e;
code_r0x00109bfa:
  uVar41 = uVar41 + 1;
  lVar27 = lVar27 + -8;
  if (uVar19 >> 3 == uVar41) goto LAB_0010b4fa;
  goto LAB_00109be4;
code_r0x0010a49a:
  uVar28 = uVar28 + 1;
  lVar48 = lVar48 + -8;
  if (uVar33 == uVar28) goto code_r0x0010a4ab;
  goto LAB_0010a488;
code_r0x0010a4ab:
  uVar28 = -lVar48;
  piVar2 = (int *)((long)local_148 - lVar48);
joined_r0x0010a559:
  for (; (uVar47 != 0 && (ringbuffer[uVar28 + (uVar23 & ringbuffer_mask)] == (uint8_t)*piVar2));
      uVar28 = uVar28 + 1) {
    uVar47 = uVar47 - 1;
    piVar2 = (int *)((long)piVar2 + 1);
  }
LAB_0010a4cc:
  if ((!bVar53 && !bVar9) &&
     (uVar23 = (ulong)(int)num_literals[(long)psVar34 * 2], uVar23 < uVar28 + uVar32)) {
    uVar28 = uVar23 - uVar32;
  }
  if ((1 < uVar28) && (uVar23 = uVar28 * 0x87 + 0x78f, uVar15 < uVar23)) {
    if (lVar30 != 0) {
      uVar23 = uVar23 - ((0x1ca10U >> ((byte)lVar30 & 0xe) & 0xe) + 0x27);
    }
    if (uVar15 < uVar23) {
      uVar15 = uVar23;
      uVar21 = uVar28;
      local_150 = uVar52;
      local_130 = uVar28;
    }
  }
LAB_0010a537:
  lVar30 = lVar30 + 1;
  if (lVar30 == 10) goto LAB_0010a58d;
  goto LAB_0010a43c;
LAB_0010a58d:
  lVar30 = *(long *)&(params->hasher).num_last_distances_to_check;
  uVar23 = uVar32 - *(uint *)(lVar27 + uVar49 * 4);
  uVar25 = *(ushort *)(lVar27 + 0x20000 + uVar49 * 2);
  if (lVar30 != 0) {
    uVar47 = 0;
    uVar52 = uVar23;
    uVar50 = uVar25;
LAB_0010a5d0:
    uVar47 = uVar52 + uVar47;
    if (uVar47 <= uVar36) {
      if (uVar21 + uVar22 <= ringbuffer_mask) {
        uVar52 = uVar32 - uVar47 & ringbuffer_mask;
        if ((ringbuffer_mask < uVar21 + uVar52) ||
           (ringbuffer[uVar21 + uVar22] != ringbuffer[uVar21 + uVar52])) goto LAB_0010a6c1;
        uVar28 = uVar44;
        if (7 < uVar19) {
          lVar48 = 0;
          uVar29 = 0;
LAB_0010a624:
          if (*(ulong *)(local_148 + uVar29 * 2) == *(ulong *)(ringbuffer + uVar29 * 8 + uVar52))
          goto code_r0x0010a637;
          uVar28 = *(ulong *)(ringbuffer + uVar29 * 8 + uVar52) ^ *(ulong *)(local_148 + uVar29 * 2)
          ;
          uVar52 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
            }
          }
          uVar29 = (uVar52 >> 3 & 0x1fffffff) - lVar48;
          goto LAB_0010a66f;
        }
        uVar29 = 0;
        piVar2 = local_148;
        goto joined_r0x0010a6f9;
      }
      goto LAB_0010a6c1;
    }
  }
LAB_0010a721:
  uVar50 = (ushort)(params->hasher).block_bits;
  *(ushort *)&(params->hasher).block_bits = uVar50 + 1;
  *(char *)(lVar27 + 0x30000 + (uVar32 & 0xffff)) = cVar42;
  if (0xfffe < uVar23) {
    uVar23 = 0xffff;
  }
  *(short *)(lVar27 + 0x40000 + (ulong)uVar50 * 4) = (short)uVar23;
  *(ushort *)(lVar27 + 0x40002 + (ulong)uVar50 * 4) = uVar25;
  *(int *)(lVar27 + uVar49 * 4) = (int)uVar32;
  *(ushort *)(lVar27 + 0x20000 + uVar49 * 2) = uVar50;
  iVar11 = 0;
  if (uVar15 == 0x7e4) {
    if (bVar9) {
      lVar27 = *(long *)&(params->dist).alphabet_size_max;
      uVar21 = *(ulong *)(lVar27 + 8);
      local_b0 = *(ulong *)(lVar27 + 0x10);
      if (uVar21 >> 7 <= local_b0) {
        uVar33 = (ulong)((uint)(*local_148 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        lVar30 = *(long *)(literal_context_lut + 0x78);
        iVar11 = 0;
        uVar15 = 0x7e4;
        bVar53 = true;
LAB_0010a82d:
        uVar21 = uVar21 + 1;
        *(ulong *)(lVar27 + 8) = uVar21;
        bVar18 = *(byte *)(lVar30 + uVar33);
        uVar36 = (ulong)bVar18;
        if ((uVar36 != 0) && (uVar36 <= uVar19)) {
          uVar22 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar33 * 2);
          lVar48 = *(long *)(literal_context_lut + 0x58);
          pcVar24 = (char *)(uVar22 * uVar36 + *(long *)(lVar48 + 0xa8) +
                            (ulong)*(uint *)(lVar48 + 0x20 + uVar36 * 4));
          if (7 < bVar18) {
            uVar44 = (ulong)(bVar18 & 0xfffffff8);
            lVar35 = 0;
            uVar49 = 0;
LAB_0010a89c:
            if (*(ulong *)(pcVar24 + uVar49 * 8) == *(ulong *)(local_148 + uVar49 * 2))
            goto code_r0x0010a8ae;
            uVar49 = *(ulong *)(local_148 + uVar49 * 2) ^ *(ulong *)(pcVar24 + uVar49 * 8);
            uVar44 = 0;
            if (uVar49 != 0) {
              for (; (uVar49 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            uVar49 = (uVar44 >> 3 & 0x1fffffff) - lVar35;
            goto LAB_0010a8e0;
          }
          uVar44 = 0;
          goto LAB_0010a9f2;
        }
        goto LAB_0010a9cc;
      }
    }
    else {
      psVar34 = *(size_t **)backward_references;
LAB_0010aa70:
      uVar15 = 0x7e4;
      iVar11 = 0;
      if ((psVar34 < back_refs_position) && (uVar32 == (long)(int)num_literals[(long)psVar34 * 2]))
      {
        iVar8 = (int)num_literals[(long)psVar34 * 2 + 1];
        if (*(int *)((long)num_literals + (long)psVar34 * 0x10 + 0xc) < iVar8) {
          uVar37 = *(uint *)((long)num_literals + (long)psVar34 * 0x10 + 4);
          uVar19 = (ulong)uVar37;
          local_c8 = local_150;
          if (0x14 < uVar37 - 4 || 0x7ffffffc < iVar8) goto LAB_0010b4db;
          uVar45 = ~(uint)uVar36 + iVar8;
          lVar27 = *(long *)(literal_context_lut + 0x58);
          iVar11 = (int)uVar45 >> (*(byte *)(lVar27 + uVar19) & 0x1f);
          local_c8 = local_150;
          if (*(int *)(literal_context_lut + 0x60) <= iVar11) goto LAB_0010b4db;
          uVar38 = *(uint *)(lVar27 + 0x20 + uVar19 * 4);
          uVar6 = kBitMask[*(byte *)(lVar27 + uVar19)];
          lVar27 = *(long *)(lVar27 + 0xa8);
          uVar16 = BrotliGetTransforms();
          pvVar17 = malloc(uVar19 * 10);
          iVar12 = BrotliTransformDictionaryWord
                             (pvVar17,(ulong)uVar38 + lVar27 +
                                      (long)(int)((uVar45 & uVar6) * uVar37),uVar37,uVar16,iVar11);
          iVar40 = bcmp(local_148,pvVar17,(long)iVar12);
          iVar11 = 0;
          local_c8 = local_150;
          auVar54 = _DAT_0013b100;
          if (iVar40 == 0) {
            iVar11 = uVar37 - iVar12;
            local_130 = (long)iVar12;
            local_c8 = (long)iVar8;
          }
          goto LAB_0010b4de;
        }
        goto LAB_0010aac0;
      }
    }
    iVar11 = 0;
    uVar15 = 0x7e4;
  }
LAB_0010aac0:
  if (uVar15 < local_110 + 0xaf) {
    local_130 = local_e0;
    uVar32 = uVar14;
    uVar21 = local_118;
    local_a0 = uVar14 + lVar7;
    iVar11 = iVar12;
    if (uVar31 <= uVar14 + lVar7) {
      local_a0 = uVar31;
    }
    goto LAB_0010af1a;
  }
  local_c8 = local_150;
  uVar21 = uVar41;
  if (iVar40 == 3) goto LAB_0010af1a;
  local_118 = local_118 + 1;
  iVar40 = iVar40 + 1;
  uVar33 = uVar14 + 5;
  uVar20 = uVar20 - 1;
  local_e0 = local_130;
  uVar14 = uVar32;
  uVar21 = local_118;
  local_110 = uVar15;
  iVar12 = iVar11;
  if (uVar1 <= uVar33) goto LAB_0010af1a;
  goto LAB_0010a2b9;
code_r0x0010a637:
  uVar29 = uVar29 + 1;
  lVar48 = lVar48 + -8;
  if (uVar33 == uVar29) goto code_r0x0010a648;
  goto LAB_0010a624;
code_r0x0010a648:
  uVar29 = -lVar48;
  piVar2 = (int *)((long)local_148 - lVar48);
joined_r0x0010a6f9:
  for (; (uVar28 != 0 && (ringbuffer[uVar29 + uVar52] == (uint8_t)*piVar2)); uVar29 = uVar29 + 1) {
    uVar28 = uVar28 - 1;
    piVar2 = (int *)((long)piVar2 + 1);
  }
LAB_0010a66f:
  if ((!bVar53 && !bVar9) &&
     (uVar52 = (ulong)(int)num_literals[(long)psVar34 * 2], uVar52 < uVar29 + uVar32)) {
    uVar29 = uVar52 - uVar32;
  }
  if (3 < uVar29) {
    iVar11 = 0x1f;
    if ((uint)uVar47 != 0) {
      for (; (uint)uVar47 >> iVar11 == 0; iVar11 = iVar11 + -1) {
      }
    }
    uVar52 = (ulong)(iVar11 * -0x1e + 0x780) + uVar29 * 0x87;
    if (uVar15 < uVar52) {
      uVar15 = uVar52;
      uVar21 = uVar29;
      local_150 = uVar47;
      local_130 = uVar29;
    }
  }
LAB_0010a6c1:
  uVar52 = (ulong)uVar50;
  uVar50 = *(ushort *)(lVar27 + 0x40002 + uVar52 * 4);
  uVar52 = (ulong)*(ushort *)(lVar27 + 0x40000 + uVar52 * 4);
  lVar30 = lVar30 + -1;
  if (lVar30 == 0) goto LAB_0010a721;
  goto LAB_0010a5d0;
code_r0x0010a8ae:
  uVar49 = uVar49 + 1;
  lVar35 = lVar35 + -8;
  if (bVar18 >> 3 == uVar49) goto code_r0x0010a8ba;
  goto LAB_0010a89c;
code_r0x0010a8ba:
  pcVar24 = pcVar24 + -lVar35;
LAB_0010a9f2:
  uVar23 = uVar36 & 7;
  uVar49 = uVar44;
  if ((bVar18 & 7) != 0) {
    uVar52 = uVar44 | uVar23;
    do {
      uVar49 = uVar44;
      if (*(char *)((long)local_148 + uVar44) != *pcVar24) break;
      pcVar24 = pcVar24 + 1;
      uVar44 = uVar44 + 1;
      uVar23 = uVar23 - 1;
      uVar49 = uVar52;
    } while (uVar23 != 0);
  }
LAB_0010a8e0:
  if (((uVar49 != 0) && (uVar36 < *(uint *)(literal_context_lut + 100) + uVar49)) &&
     (uVar36 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar36 - uVar49) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar36 - uVar49) * 4 << (*(byte *)(lVar48 + uVar36) & 0x3f)) +
               uVar22 + local_a0 + 1, uVar36 <= uVar51)) {
    iVar8 = 0x1f;
    if ((uint)uVar36 != 0) {
      for (; (uint)uVar36 >> iVar8 == 0; iVar8 = iVar8 + -1) {
      }
    }
    uVar22 = (uVar49 * 0x87 - (ulong)(uint)(iVar8 * 0x1e)) + 0x780;
    if (uVar15 <= uVar22) {
      iVar11 = (uint)bVar18 - (int)uVar49;
      local_b0 = local_b0 + 1;
      *(ulong *)(lVar27 + 0x10) = local_b0;
      uVar15 = uVar22;
      local_150 = uVar36;
      local_130 = uVar49;
    }
  }
LAB_0010a9cc:
  uVar33 = uVar33 + 1;
  bVar10 = !bVar53;
  bVar53 = false;
  if (bVar10) goto LAB_0010aac0;
  goto LAB_0010a82d;
LAB_0010b44b:
  if (*(ulong *)(ringbuffer + uVar41 * 8 + uVar22) == *(ulong *)(ringbuffer + uVar41 * 8 + uVar14))
  goto code_r0x0010b458;
  uVar14 = *(ulong *)(ringbuffer + uVar41 * 8 + uVar14) ^
           *(ulong *)(ringbuffer + uVar41 * 8 + uVar22);
  uVar19 = 0;
  if (uVar14 != 0) {
    for (; (uVar14 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
    }
  }
  uVar41 = (uVar19 >> 3 & 0x1fffffff) - lVar27;
  goto LAB_0010b489;
code_r0x0010b458:
  uVar41 = uVar41 + 1;
  lVar27 = lVar27 + -8;
  if (uVar33 == uVar41) goto code_r0x0010b469;
  goto LAB_0010b44b;
code_r0x0010b469:
  local_148 = (int *)(ringbuffer + (uVar22 - lVar27));
  uVar41 = -lVar27;
LAB_0010b543:
  uVar19 = uVar19 & 7;
  for (; (uVar19 != 0 && (ringbuffer[uVar41 + uVar14] == (uint8_t)*local_148)); uVar41 = uVar41 + 1)
  {
    local_148 = (int *)((long)local_148 + 1);
    uVar19 = uVar19 - 1;
  }
LAB_0010b489:
  local_130 = (ulong)*(int *)((long)num_literals + (long)psVar34 * 0x10 + 4);
  local_c8 = uVar21;
  if (uVar41 < local_130) {
    local_130 = uVar41;
  }
LAB_0010b4db:
  iVar11 = 0;
LAB_0010b4de:
  uVar21 = local_118 + 1;
  goto LAB_0010af1a;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}